

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O2

void __thiscall
CaDiCaL::heap<CaDiCaL::block_more_occs_size>::down(heap<CaDiCaL::block_more_occs_size> *this,uint e)

{
  bool bVar1;
  uint a;
  uint b;
  
  while( true ) {
    bVar1 = has_left(this,e);
    if (!bVar1) {
      return;
    }
    a = left(this,e);
    bVar1 = has_right(this,e);
    b = a;
    if (bVar1) {
      b = right(this,e);
      bVar1 = block_more_occs_size::operator()(&this->less,a,b);
      if (!bVar1) {
        b = a;
      }
    }
    bVar1 = block_more_occs_size::operator()(&this->less,e,b);
    if (!bVar1) break;
    exchange(this,e,b);
  }
  return;
}

Assistant:

void down (unsigned e) {
    while (has_left (e)) {
      unsigned c = left (e);
      if (has_right (e)) {
        unsigned r = right (e);
        if (less (c, r))
          c = r;
      }
      if (!less (e, c))
        break;
      exchange (e, c);
    }
  }